

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLRefInfo::serialize(XMLRefInfo *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  XMLRefInfo *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,(bool)(this->fDeclared & 1));
    XSerializeEngine::operator<<(serEng,(bool)(this->fUsed & 1));
    XSerializeEngine::writeString(serEng,this->fRefName,0,false);
  }
  else {
    XSerializeEngine::operator>>(serEng,&this->fDeclared);
    XSerializeEngine::operator>>(serEng,&this->fUsed);
    XSerializeEngine::readString(serEng,&this->fRefName);
  }
  return;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}